

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_movcond_i32_mips64
               (TCGContext_conflict5 *tcg_ctx,TCGCond cond,TCGv_i32 ret,TCGv_i32 c1,TCGv_i32 c2,
               TCGv_i32 v1,TCGv_i32 v2)

{
  TCGv_i32 v1_local;
  TCGv_i32 c2_local;
  TCGv_i32 c1_local;
  TCGv_i32 ret_local;
  TCGCond cond_local;
  TCGContext_conflict5 *tcg_ctx_local;
  
  if (cond == TCG_COND_ALWAYS) {
    tcg_gen_mov_i32(tcg_ctx,ret,v1);
  }
  else if (cond == TCG_COND_NEVER) {
    tcg_gen_mov_i32(tcg_ctx,ret,v2);
  }
  else {
    tcg_gen_op6i_i32(tcg_ctx,INDEX_op_movcond_i32,ret,c1,c2,v1,v2,(ulong)cond);
  }
  return;
}

Assistant:

void tcg_gen_movcond_i32(TCGContext *tcg_ctx, TCGCond cond, TCGv_i32 ret, TCGv_i32 c1,
                         TCGv_i32 c2, TCGv_i32 v1, TCGv_i32 v2)
{
    if (cond == TCG_COND_ALWAYS) {
        tcg_gen_mov_i32(tcg_ctx, ret, v1);
    } else if (cond == TCG_COND_NEVER) {
        tcg_gen_mov_i32(tcg_ctx, ret, v2);
    } else if (TCG_TARGET_HAS_movcond_i32) {
        tcg_gen_op6i_i32(tcg_ctx, INDEX_op_movcond_i32, ret, c1, c2, v1, v2, cond);
    } else {
        TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_setcond_i32(tcg_ctx, cond, t0, c1, c2);
        tcg_gen_neg_i32(tcg_ctx, t0, t0);
        tcg_gen_and_i32(tcg_ctx, t1, v1, t0);
        tcg_gen_andc_i32(tcg_ctx, ret, v2, t0);
        tcg_gen_or_i32(tcg_ctx, ret, ret, t1);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
    }
}